

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QTextUndoCommand>::emplace<QTextUndoCommand_const&>
          (QPodArrayOps<QTextUndoCommand> *this,qsizetype i,QTextUndoCommand *args)

{
  QTextUndoCommand **ppQVar1;
  qsizetype *pqVar2;
  quint32 qVar3;
  Data *pDVar4;
  anon_union_8_4_8516307b_for_QTextUndoCommand_8 aVar5;
  quint16 qVar6;
  undefined1 uVar7;
  quint8 qVar8;
  int iVar9;
  quint32 qVar10;
  quint32 qVar11;
  undefined4 uVar12;
  QTextUndoCommand *pQVar13;
  GrowthPosition where;
  
  pDVar4 = (this->super_QArrayDataPointer<QTextUndoCommand>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_004d7396:
    qVar6 = args->command;
    uVar7 = args->field_0x2;
    qVar8 = args->operation;
    qVar3 = args->pos;
    aVar5 = args->field_8;
    qVar11 = args->revision;
    uVar12 = *(undefined4 *)&args->field_0x1c;
    iVar9 = args->format;
    qVar10 = args->strPos;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTextUndoCommand>).size != 0);
    QArrayDataPointer<QTextUndoCommand>::detachAndGrow
              (&this->super_QArrayDataPointer<QTextUndoCommand>,where,1,(QTextUndoCommand **)0x0,
               (QArrayDataPointer<QTextUndoCommand> *)0x0);
    pQVar13 = createHole(this,where,i,1);
    pQVar13->command = qVar6;
    pQVar13->field_0x2 = uVar7;
    pQVar13->operation = qVar8;
    pQVar13->format = iVar9;
    pQVar13->strPos = qVar10;
    pQVar13->pos = qVar3;
    pQVar13->field_8 = aVar5;
    pQVar13->revision = qVar11;
    *(undefined4 *)&pQVar13->field_0x1c = uVar12;
  }
  else {
    if (((this->super_QArrayDataPointer<QTextUndoCommand>).size == i) &&
       (pQVar13 = (this->super_QArrayDataPointer<QTextUndoCommand>).ptr,
       (pDVar4->super_QArrayData).alloc !=
       ((long)((long)pQVar13 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      qVar6 = args->command;
      uVar7 = args->field_0x2;
      qVar8 = args->operation;
      iVar9 = args->format;
      qVar3 = args->strPos;
      qVar10 = args->pos;
      aVar5 = *(anon_union_8_4_8516307b_for_QTextUndoCommand_8 *)&args->revision;
      pQVar13[i].field_8 = args->field_8;
      (&pQVar13[i].field_8)[1] = aVar5;
      pQVar13 = pQVar13 + i;
      pQVar13->command = qVar6;
      pQVar13->field_0x2 = uVar7;
      pQVar13->operation = qVar8;
      pQVar13->format = iVar9;
      pQVar13->strPos = qVar3;
      pQVar13->pos = qVar10;
    }
    else {
      if ((i != 0) ||
         (pQVar13 = (this->super_QArrayDataPointer<QTextUndoCommand>).ptr,
         (QTextUndoCommand *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar13))
      goto LAB_004d7396;
      qVar6 = args->command;
      uVar7 = args->field_0x2;
      qVar8 = args->operation;
      iVar9 = args->format;
      qVar10 = args->strPos;
      qVar11 = args->pos;
      qVar3 = args->revision;
      uVar12 = *(undefined4 *)&args->field_0x1c;
      pQVar13[-1].field_8 = args->field_8;
      pQVar13[-1].revision = qVar3;
      *(undefined4 *)&pQVar13[-1].field_0x1c = uVar12;
      pQVar13[-1].command = qVar6;
      pQVar13[-1].field_0x2 = uVar7;
      pQVar13[-1].operation = qVar8;
      pQVar13[-1].format = iVar9;
      pQVar13[-1].strPos = qVar10;
      pQVar13[-1].pos = qVar11;
      ppQVar1 = &(this->super_QArrayDataPointer<QTextUndoCommand>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTextUndoCommand>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }